

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_postsolve(void *highs,double *col_value,double *col_dual,double *row_dual)

{
  HighsStatus HVar1;
  reference pvVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Highs *in_RDI;
  HighsInt iRow;
  HighsInt iCol;
  HighsSolution solution;
  HighsInt num_row;
  HighsInt num_col;
  HighsLp *presolved_lp;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  size_type in_stack_ffffffffffffff48;
  value_type vVar3;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar4;
  int local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  HighsSolution *in_stack_ffffffffffffffa8;
  Highs *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> local_48;
  HighsInt local_30;
  HighsInt local_2c;
  HighsLp *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = Highs::getPresolvedLp(in_RDI);
  local_2c = local_28->num_col_;
  local_30 = local_28->num_row_;
  HighsSolution::HighsSolution
            ((HighsSolution *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (local_10 != 0) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
  }
  if ((local_18 != 0) || (local_20 != 0)) {
    if (local_18 != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
    }
    if (local_20 != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
    }
  }
  for (local_a8 = 0; local_a8 < local_2c; local_a8 = local_a8 + 1) {
    if (local_10 != 0) {
      vVar3 = *(value_type *)(local_10 + (long)local_a8 * 8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_a8);
      *pvVar2 = vVar3;
    }
    if (local_18 != 0) {
      vVar3 = *(value_type *)(local_18 + (long)local_a8 * 8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(long)local_a8);
      *pvVar2 = vVar3;
    }
  }
  if (local_20 != 0) {
    for (iVar4 = 0; iVar4 < local_30; iVar4 = iVar4 + 1) {
      vVar3 = *(value_type *)(local_20 + (long)iVar4 * 8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(long)iVar4);
      *pvVar2 = vVar3;
    }
  }
  HVar1 = Highs::postsolve(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  HighsSolution::~HighsSolution((HighsSolution *)CONCAT44(HVar1,in_stack_ffffffffffffff30));
  return HVar1;
}

Assistant:

HighsInt Highs_postsolve(void* highs, const double* col_value,
                         const double* col_dual, const double* row_dual) {
  const HighsLp& presolved_lp = ((Highs*)highs)->getPresolvedLp();
  HighsInt num_col = presolved_lp.num_col_;
  HighsInt num_row = presolved_lp.num_row_;
  // Create a HighsSolution from what's been passed
  HighsSolution solution;
  if (col_value) {
    solution.value_valid = true;
    solution.col_value.resize(num_col);
    // No need for primal row values, but resize the vector for later
    // use
    solution.row_value.resize(num_row);
  }
  if (col_dual || row_dual) {
    // If column or row duals are passed, assume that they are
    // valid. If either is a null pointer, then the corresponding
    // vector will have no data, and the size check will fail
    solution.dual_valid = true;
    if (col_dual) solution.col_dual.resize(num_col);
    if (row_dual) solution.row_dual.resize(num_row);
  }
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (col_value) solution.col_value[iCol] = col_value[iCol];
    if (col_dual) solution.col_dual[iCol] = col_dual[iCol];
  }
  if (row_dual) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      solution.row_dual[iRow] = row_dual[iRow];
  }
  return (HighsInt)((Highs*)highs)->postsolve(solution);
}